

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__read_bext_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize)

{
  ma_result mVar1;
  char *pcVar2;
  ma_uint8 *pmVar3;
  size_t sVar4;
  long in_RDX;
  undefined4 *in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  size_t extraBytes;
  ma_uint32 timeReferenceHigh;
  ma_uint32 timeReferenceLow;
  ma_dr_wav_buffer_reader reader;
  size_t bytesRead;
  ma_uint8 bextData [602];
  size_t in_stack_fffffffffffffd38;
  void *in_stack_fffffffffffffd40;
  ma_dr_wav__metadata_parser *pBufferOut;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffd48;
  ma_dr_wav__metadata_parser *pParser_00;
  char *in_stack_fffffffffffffd50;
  ma_dr_wav__metadata_parser *pDst;
  ma_dr_wav__metadata_parser *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  ma_dr_wav_buffer_reader local_298;
  size_t local_280;
  long local_18;
  undefined4 *local_10;
  ma_dr_wav__metadata_parser *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_280 = ma_dr_wav__metadata_parser_read
                        (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                         in_stack_fffffffffffffd38,(ma_uint64 *)0x26c92a);
  if (local_280 == 0x25a) {
    *local_10 = 0x20;
    mVar1 = ma_dr_wav_buffer_reader_init
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (ma_dr_wav_buffer_reader *)0x26c960);
    if (mVar1 == MA_SUCCESS) {
      pBufferOut = local_8;
      ma_dr_wav_buffer_reader_ptr(&local_298);
      pcVar2 = ma_dr_wav__metadata_copy_string
                         (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                          (size_t)in_stack_fffffffffffffd48);
      *(char **)(local_10 + 2) = pcVar2;
      ma_dr_wav_buffer_reader_seek(&local_298,0x100);
      pParser_00 = local_8;
      ma_dr_wav_buffer_reader_ptr(&local_298);
      pcVar2 = ma_dr_wav__metadata_copy_string
                         (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,(size_t)pParser_00);
      *(char **)(local_10 + 4) = pcVar2;
      ma_dr_wav_buffer_reader_seek(&local_298,0x20);
      pDst = local_8;
      ma_dr_wav_buffer_reader_ptr(&local_298);
      pcVar2 = ma_dr_wav__metadata_copy_string
                         (in_stack_fffffffffffffd58,(char *)pDst,(size_t)pParser_00);
      *(char **)(local_10 + 6) = pcVar2;
      ma_dr_wav_buffer_reader_seek(&local_298,0x20);
      ma_dr_wav_buffer_reader_read
                ((ma_dr_wav_buffer_reader *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd58,(size_t)pDst,(size_t *)pParser_00);
      ma_dr_wav_buffer_reader_read
                ((ma_dr_wav_buffer_reader *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd58,(size_t)pDst,(size_t *)pParser_00);
      ma_dr_wav_buffer_reader_read_u32
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint32 *)pDst);
      ma_dr_wav_buffer_reader_read_u32
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint32 *)pDst);
      *(ulong *)(local_10 + 0xe) = CONCAT44(in_stack_fffffffffffffd60,in_stack_fffffffffffffd64);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      pmVar3 = ma_dr_wav__metadata_get_memory(local_8,0x40,1);
      *(ma_uint8 **)(local_10 + 0x16) = pmVar3;
      ma_dr_wav_buffer_reader_read
                ((ma_dr_wav_buffer_reader *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd58,(size_t)pDst,(size_t *)pParser_00);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      ma_dr_wav_buffer_reader_read_u16
                ((ma_dr_wav_buffer_reader *)in_stack_fffffffffffffd58,(ma_uint16 *)pDst);
      if (local_18 == 0x25a) {
        *(undefined8 *)(local_10 + 0x12) = 0;
        local_10[0x14] = 0;
      }
      else {
        pmVar3 = ma_dr_wav__metadata_get_memory(local_8,local_18 - 0x259,1);
        *(ma_uint8 **)(local_10 + 0x12) = pmVar3;
        sVar4 = ma_dr_wav__metadata_parser_read
                          (pParser_00,pBufferOut,in_stack_fffffffffffffd38,(ma_uint64 *)0x26cc07);
        local_280 = sVar4 + local_280;
        sVar4 = ma_dr_wav__strlen(*(char **)(local_10 + 0x12));
        local_10[0x14] = (int)sVar4;
      }
    }
  }
  return local_280;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_bext_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize)
{
    ma_uint8 bextData[MA_DR_WAV_BEXT_BYTES];
    size_t bytesRead = ma_dr_wav__metadata_parser_read(pParser, bextData, sizeof(bextData), NULL);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesRead == sizeof(bextData)) {
        ma_dr_wav_buffer_reader reader;
        ma_uint32 timeReferenceLow;
        ma_uint32 timeReferenceHigh;
        size_t extraBytes;
        pMetadata->type = ma_dr_wav_metadata_type_bext;
        if (ma_dr_wav_buffer_reader_init(bextData, bytesRead, &reader) == MA_SUCCESS) {
            pMetadata->data.bext.pDescription = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
            pMetadata->data.bext.pOriginatorName = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
            pMetadata->data.bext.pOriginatorReference = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate), NULL);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime), NULL);
            ma_dr_wav_buffer_reader_read_u32(&reader, &timeReferenceLow);
            ma_dr_wav_buffer_reader_read_u32(&reader, &timeReferenceHigh);
            pMetadata->data.bext.timeReference = ((ma_uint64)timeReferenceHigh << 32) + timeReferenceLow;
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.version);
            pMetadata->data.bext.pUMID = ma_dr_wav__metadata_get_memory(pParser, MA_DR_WAV_BEXT_UMID_BYTES, 1);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES, NULL);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.loudnessValue);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.loudnessRange);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxTruePeakLevel);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxMomentaryLoudness);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxShortTermLoudness);
            MA_DR_WAV_ASSERT((ma_dr_wav_offset_ptr(ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_RESERVED_BYTES)) == (bextData + MA_DR_WAV_BEXT_BYTES));
            extraBytes = (size_t)(chunkSize - MA_DR_WAV_BEXT_BYTES);
            if (extraBytes > 0) {
                pMetadata->data.bext.pCodingHistory = (char*)ma_dr_wav__metadata_get_memory(pParser, extraBytes + 1, 1);
                MA_DR_WAV_ASSERT(pMetadata->data.bext.pCodingHistory != NULL);
                bytesRead += ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.bext.pCodingHistory, extraBytes, NULL);
                pMetadata->data.bext.codingHistorySize = (ma_uint32)ma_dr_wav__strlen(pMetadata->data.bext.pCodingHistory);
            } else {
                pMetadata->data.bext.pCodingHistory    = NULL;
                pMetadata->data.bext.codingHistorySize = 0;
            }
        }
    }
    return bytesRead;
}